

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

JsonParse * jsonParseCached(sqlite3_context *pCtx,sqlite3_value **argv,sqlite3_context *pErrCtx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uchar *__s2;
  sqlite3_context *psVar5;
  JsonParse *pParse;
  uint local_58;
  uint local_54;
  u32 iMaxHold;
  u32 iMinHold;
  int iMinKey;
  int iKey;
  JsonParse *pMatch;
  JsonParse *p;
  int nJson;
  char *zJson;
  sqlite3_context *pErrCtx_local;
  sqlite3_value **argv_local;
  sqlite3_context *pCtx_local;
  
  __s2 = sqlite3_value_text(*argv);
  iVar3 = sqlite3_value_bytes(*argv);
  _iMinKey = (sqlite3_context *)0x0;
  iMaxHold = 0;
  local_54 = 0xffffffff;
  local_58 = 0;
  if (__s2 == (uchar *)0x0) {
    pCtx_local = (sqlite3_context *)0x0;
  }
  else {
    for (iMinHold = 0; (int)iMinHold < 4; iMinHold = iMinHold + 1) {
      psVar5 = (sqlite3_context *)sqlite3_get_auxdata(pCtx,iMinHold - 0x68f72);
      if (psVar5 == (sqlite3_context *)0x0) {
        iMaxHold = iMinHold;
        break;
      }
      if (((_iMinKey == (sqlite3_context *)0x0) && (psVar5->isError == iVar3)) &&
         (iVar4 = memcmp(psVar5->pMem,__s2,(long)iVar3), iVar4 == 0)) {
        *(undefined1 *)((long)&psVar5->iOp + 1) = 0;
        _iMinKey = psVar5;
      }
      else {
        uVar1._0_1_ = psVar5->skipFlag;
        uVar1._1_1_ = psVar5->argc;
        uVar1._2_2_ = *(undefined2 *)&psVar5->field_0x2a;
        if (uVar1 < local_54) {
          local_54._0_1_ = psVar5->skipFlag;
          local_54._1_1_ = psVar5->argc;
          local_54._2_2_ = *(undefined2 *)&psVar5->field_0x2a;
          iMaxHold = iMinHold;
        }
      }
      uVar2._0_1_ = psVar5->skipFlag;
      uVar2._1_1_ = psVar5->argc;
      uVar2._2_2_ = *(undefined2 *)&psVar5->field_0x2a;
      if (local_58 < uVar2) {
        local_58._0_1_ = psVar5->skipFlag;
        local_58._1_1_ = psVar5->argc;
        local_58._2_2_ = *(undefined2 *)&psVar5->field_0x2a;
      }
    }
    if (_iMinKey == (sqlite3_context *)0x0) {
      pParse = (JsonParse *)sqlite3_malloc64((long)iVar3 + 0x31);
      if (pParse == (JsonParse *)0x0) {
        sqlite3_result_error_nomem(pCtx);
        pCtx_local = (sqlite3_context *)0x0;
      }
      else {
        memset(pParse,0,0x30);
        pParse->zJson = (char *)(pParse + 1);
        memcpy(pParse->zJson,__s2,(long)(iVar3 + 1));
        iVar4 = jsonParse(pParse,pErrCtx,pParse->zJson);
        if (iVar4 == 0) {
          pParse->nJson = iVar3;
          pParse->iHold = local_58 + 1;
          sqlite3_set_auxdata(pCtx,iMaxHold - 0x68f72,pParse,jsonParseFree);
          pCtx_local = (sqlite3_context *)sqlite3_get_auxdata(pCtx,iMaxHold - 0x68f72);
        }
        else {
          sqlite3_free(pParse);
          pCtx_local = (sqlite3_context *)0x0;
        }
      }
    }
    else {
      *(undefined1 *)((long)&_iMinKey->iOp + 1) = 0;
      *(uint *)&_iMinKey->skipFlag = local_58 + 1;
      pCtx_local = _iMinKey;
    }
  }
  return (JsonParse *)pCtx_local;
}

Assistant:

static JsonParse *jsonParseCached(
  sqlite3_context *pCtx,
  sqlite3_value **argv,
  sqlite3_context *pErrCtx
){
  const char *zJson = (const char*)sqlite3_value_text(argv[0]);
  int nJson = sqlite3_value_bytes(argv[0]);
  JsonParse *p;
  JsonParse *pMatch = 0;
  int iKey;
  int iMinKey = 0;
  u32 iMinHold = 0xffffffff;
  u32 iMaxHold = 0;
  if( zJson==0 ) return 0;
  for(iKey=0; iKey<JSON_CACHE_SZ; iKey++){
    p = (JsonParse*)sqlite3_get_auxdata(pCtx, JSON_CACHE_ID+iKey);
    if( p==0 ){
      iMinKey = iKey;
      break;
    }
    if( pMatch==0
     && p->nJson==nJson
     && memcmp(p->zJson,zJson,nJson)==0
    ){
      p->nErr = 0;
      pMatch = p;
    }else if( p->iHold<iMinHold ){
      iMinHold = p->iHold;
      iMinKey = iKey;
    }
    if( p->iHold>iMaxHold ){
      iMaxHold = p->iHold;
    }
  }
  if( pMatch ){
    pMatch->nErr = 0;
    pMatch->iHold = iMaxHold+1;
    return pMatch;
  }
  p = sqlite3_malloc64( sizeof(*p) + nJson + 1 );
  if( p==0 ){
    sqlite3_result_error_nomem(pCtx);
    return 0;
  }
  memset(p, 0, sizeof(*p));
  p->zJson = (char*)&p[1];
  memcpy((char*)p->zJson, zJson, nJson+1);
  if( jsonParse(p, pErrCtx, p->zJson) ){
    sqlite3_free(p);
    return 0;
  }
  p->nJson = nJson;
  p->iHold = iMaxHold+1;
  sqlite3_set_auxdata(pCtx, JSON_CACHE_ID+iMinKey, p,
                      (void(*)(void*))jsonParseFree);
  return (JsonParse*)sqlite3_get_auxdata(pCtx, JSON_CACHE_ID+iMinKey);
}